

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guiddatabase.cpp
# Opt level: O2

GuidDatabase *
guidDatabaseFromTreeRecursive
          (GuidDatabase *__return_storage_ptr__,TreeModel *model,UModelIndex index)

{
  _Rb_tree_header *p_Var1;
  UModelIndex index_00;
  bool bVar2;
  UINT8 UVar3;
  int iVar4;
  mapped_type *this;
  int __c;
  GuidDatabase tmpDb;
  CBString local_98;
  UByteArray local_80;
  TreeModel local_60;
  TreeModel *local_50;
  key_type local_48;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar2 = UModelIndex::isValid(&index);
  if (bVar2) {
    __c = 0;
    while( true ) {
      iVar4 = TreeModel::rowCount(model,&index);
      if (iVar4 <= __c) break;
      TreeModel::index(&local_60,(char *)index.m,__c);
      index_00.i._0_1_ = local_60.markingEnabledFlag;
      index_00.i._1_1_ = local_60.markingDarkModeFlag;
      index_00.i._2_6_ = local_60._10_6_;
      index_00._0_8_ = local_60.rootItem;
      index_00.m = local_50;
      guidDatabaseFromTreeRecursive((GuidDatabase *)&tmpDb._M_t,model,index_00);
      std::
      _Rb_tree<EFI_GUID_,std::pair<EFI_GUID_const,Bstrlib::CBString>,std::_Select1st<std::pair<EFI_GUID_const,Bstrlib::CBString>>,OperatorLessForGuids,std::allocator<std::pair<EFI_GUID_const,Bstrlib::CBString>>>
      ::_M_insert_range_unique<std::_Rb_tree_iterator<std::pair<EFI_GUID_const,Bstrlib::CBString>>>
                ((_Rb_tree<EFI_GUID_,std::pair<EFI_GUID_const,Bstrlib::CBString>,std::_Select1st<std::pair<EFI_GUID_const,Bstrlib::CBString>>,OperatorLessForGuids,std::allocator<std::pair<EFI_GUID_const,Bstrlib::CBString>>>
                  *)__return_storage_ptr__,
                 (_Rb_tree_iterator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>)
                 tmpDb._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_iterator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>)
                 &tmpDb._M_t._M_impl.super__Rb_tree_header);
      std::
      _Rb_tree<EFI_GUID_,_std::pair<const_EFI_GUID_,_Bstrlib::CBString>,_std::_Select1st<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>,_OperatorLessForGuids,_std::allocator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>_>
      ::~_Rb_tree(&tmpDb._M_t);
      __c = __c + 1;
    }
    UVar3 = TreeModel::type(model,&index);
    if (UVar3 == 'B') {
      TreeModel::text((CBString *)&tmpDb,model,&index);
      Bstrlib::CBString::~CBString((CBString *)&tmpDb);
      if (tmpDb._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ != 0) {
        TreeModel::text(&local_98,model,&index);
        TreeModel::header(&local_80,model,&index);
        UByteArray::left((UByteArray *)&tmpDb,&local_80,0x10);
        local_48._0_8_ = *(undefined8 *)tmpDb._M_t._M_impl._0_8_;
        local_48.Data4 = *(UINT8 (*) [8])(tmpDb._M_t._M_impl._0_8_ + 8);
        this = std::
               map<EFI_GUID_,_Bstrlib::CBString,_OperatorLessForGuids,_std::allocator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>_>
               ::operator[](__return_storage_ptr__,&local_48);
        Bstrlib::CBString::operator=(this,&local_98);
        std::__cxx11::string::~string((string *)&tmpDb);
        std::__cxx11::string::~string((string *)&local_80);
        Bstrlib::CBString::~CBString(&local_98);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

GuidDatabase guidDatabaseFromTreeRecursive(TreeModel * model, const UModelIndex index)
{
    GuidDatabase db;
    
    if (!index.isValid())
        return db;
    
    for (int i = 0; i < model->rowCount(index); i++) {
        GuidDatabase tmpDb = guidDatabaseFromTreeRecursive(model, index.model()->index(i, index.column(), index));
        
        db.insert(tmpDb.begin(), tmpDb.end());
    }
    
    if (model->type(index) == Types::File && !model->text(index).isEmpty())
        db[readUnaligned((const EFI_GUID*)model->header(index).left(16).constData())] = model->text(index);
    
    return db;
}